

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O0

Value __thiscall jbcoin::STArray::getJson(STArray *this,int p)

{
  bool bVar1;
  int iVar2;
  vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_> *this_00;
  Value *pVVar3;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  Value VVar4;
  Value local_a8;
  undefined1 local_98 [8];
  string k;
  SField *fname;
  Value *local_60;
  Value *inner;
  reference local_48;
  STObject *object;
  const_iterator __end1;
  const_iterator __begin1;
  list_type *__range1;
  int index;
  int p_local;
  STArray *this_local;
  Value *v;
  
  Json::Value::Value((Value *)this,arrayValue);
  __range1._4_4_ = 1;
  this_00 = (vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_> *)
            (CONCAT44(in_register_00000034,p) + 0x10);
  __end1 = std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::begin(this_00);
  object = (STObject *)
           std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_jbcoin::STObject_*,_std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>_>
                                     *)&object), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_jbcoin::STObject_*,_std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>_>
               ::operator*(&__end1);
    iVar2 = (*(local_48->super_STBase)._vptr_STBase[4])();
    if (iVar2 != 0) {
      Json::Value::Value((Value *)&fname,objectValue);
      pVVar3 = Json::Value::append((Value *)this,(Value *)&fname);
      Json::Value::~Value((Value *)&fname);
      local_60 = pVVar3;
      k.field_2._8_8_ = STBase::getFName(&local_48->super_STBase);
      bVar1 = SField::hasName((SField *)k.field_2._8_8_);
      if (bVar1) {
        std::__cxx11::string::string((string *)local_98,(string *)(k.field_2._8_8_ + 0x10));
      }
      else {
        std::__cxx11::to_string((string *)local_98,__range1._4_4_);
      }
      (*(local_48->super_STBase)._vptr_STBase[7])(&local_a8,local_48,(ulong)in_EDX);
      pVVar3 = Json::Value::operator[](local_60,(string *)local_98);
      Json::Value::operator=(pVVar3,&local_a8);
      Json::Value::~Value(&local_a8);
      __range1._4_4_ = __range1._4_4_ + 1;
      std::__cxx11::string::~string((string *)local_98);
    }
    __gnu_cxx::
    __normal_iterator<const_jbcoin::STObject_*,_std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>_>
    ::operator++(&__end1);
  }
  VVar4._8_8_ = extraout_RDX;
  VVar4.value_.map_ = (ObjectValues *)this;
  return VVar4;
}

Assistant:

Json::Value STArray::getJson (int p) const
{
    Json::Value v = Json::arrayValue;
    int index = 1;
    for (auto const& object: v_)
    {
        if (object.getSType () != STI_NOTPRESENT)
        {
            Json::Value& inner = v.append (Json::objectValue);
            auto const& fname = object.getFName ();
            auto k = fname.hasName () ? fname.fieldName : std::to_string(index);
            inner[k] = object.getJson (p);
            index++;
        }
    }
    return v;
}